

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O1

void __thiscall
websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::init_asio
          (endpoint<websocketpp::config::asio::transport_config> *this,io_service_ptr ptr,
          error_code *ec)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  basic_socket_acceptor<asio::ip::tcp> *pbVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  int iVar3;
  size_t in_RCX;
  int iVar4;
  error_category *peVar5;
  undefined1 local_39;
  basic_socket_acceptor<asio::ip::tcp> *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  reference_wrapper<asio::io_context> local_28;
  
  if (this->m_state == UNINITIALIZED) {
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              ((this->m_alog).
               super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,0x400,"asio::init_asio",in_RCX);
    this->m_io_service = ptr;
    this->m_external_io_service = true;
    local_38 = (element_type *)0x0;
    local_28._M_data = ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<asio::basic_socket_acceptor<asio::ip::tcp>,std::allocator<asio::basic_socket_acceptor<asio::ip::tcp>>,std::reference_wrapper<asio::io_context>>
              (&_Stack_30,&local_38,
               (allocator<asio::basic_socket_acceptor<asio::ip::tcp>_> *)&local_39,&local_28);
    _Var2._M_pi = _Stack_30._M_pi;
    pbVar1 = local_38;
    local_38 = (basic_socket_acceptor<asio::ip::tcp> *)0x0;
    _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->m_acceptor).
              super___shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    (this->m_acceptor).
    super___shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = pbVar1;
    (this->m_acceptor).
    super___shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var2._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
    }
    this->m_state = READY;
    iVar4 = 0;
    peVar5 = (error_category *)std::_V2::system_category();
  }
  else {
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
              ((this->m_elog).
               super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,2,"asio::init_asio called from the wrong state",in_RCX);
    peVar5 = (error_category *)&websocketpp::error::get_category()::instance;
    iVar4 = 9;
    if (websocketpp::error::get_category()::instance == '\0') {
      iVar3 = __cxa_guard_acquire(&websocketpp::error::get_category()::instance);
      if (iVar3 != 0) {
        websocketpp::error::get_category()::instance = &PTR__error_category_001f9400;
        peVar5 = (error_category *)&websocketpp::error::get_category()::instance;
        __cxa_atexit(std::_V2::error_category::~error_category,
                     &websocketpp::error::get_category()::instance,&__dso_handle);
        __cxa_guard_release(&websocketpp::error::get_category()::instance);
      }
    }
  }
  ec->_M_value = iVar4;
  ec->_M_cat = peVar5;
  return;
}

Assistant:

void init_asio(io_service_ptr ptr, lib::error_code & ec) {
        if (m_state != UNINITIALIZED) {
            m_elog->write(log::elevel::library,
                "asio::init_asio called from the wrong state");
            using websocketpp::error::make_error_code;
            ec = make_error_code(websocketpp::error::invalid_state);
            return;
        }

        m_alog->write(log::alevel::devel,"asio::init_asio");

        m_io_service = ptr;
        m_external_io_service = true;
        m_acceptor = lib::make_shared<lib::asio::ip::tcp::acceptor>(
            lib::ref(*m_io_service));

        m_state = READY;
        ec = lib::error_code();
    }